

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZukerAlgorithm.cpp
# Opt level: O0

int __thiscall ZukerAlgorithm::calculate_W(ZukerAlgorithm *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  value_type vVar4;
  bool bVar5;
  reference pvVar6;
  char *pcVar7;
  int *piVar8;
  ZukerAlgorithm *in_RDI;
  int k;
  int j;
  int i;
  int t;
  int energy;
  int min_w;
  ZukerAlgorithm *in_stack_00000110;
  int local_28;
  uint local_24;
  int local_20;
  int local_1c;
  uint local_18;
  value_type local_14;
  int local_10;
  int local_c [3];
  
  local_c[0] = 10000000;
  local_10 = 10000000;
  local_14 = 0;
  calculate_V(in_stack_00000110);
  local_18 = 0;
  for (local_1c = 1; local_1c < in_RDI->n; local_1c = local_1c + 1) {
    local_c[0] = 10000000;
    local_10 = 10000000;
    local_14 = 0;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI->seq,(long)(int)local_18);
    iVar1 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI->seq,(long)local_1c);
    bVar5 = basepair(iVar1,*pvVar6);
    if (bVar5) {
      pcVar7 = index(in_RDI,(char *)(ulong)local_18,local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->V,(long)(int)pcVar7);
      iVar1 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI->seq,(long)(int)local_18);
      iVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI->seq,(long)local_1c);
      local_20 = iVar1 + AU[iVar2][*pvVar6];
      piVar8 = std::min<int>(local_c,&local_20);
      local_c[0] = *piVar8;
      if (local_c[0] < local_10) {
        local_14 = -1;
        local_10 = local_c[0];
      }
    }
    pcVar7 = index(in_RDI,(char *)(ulong)local_18,local_1c + -1);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->W,(long)(int)pcVar7);
    piVar8 = std::min<int>(local_c,pvVar6);
    local_c[0] = *piVar8;
    if (local_c[0] < local_10) {
      local_14 = -2;
      local_10 = local_c[0];
    }
    for (local_24 = 1; iVar1 = local_c[0], (int)local_24 <= local_1c + -4; local_24 = local_24 + 1)
    {
      pcVar7 = index(in_RDI,(char *)(ulong)local_18,local_24 - 1);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->W,(long)(int)pcVar7);
      iVar1 = *pvVar6;
      pcVar7 = index(in_RDI,(char *)(ulong)local_24,local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->V,(long)(int)pcVar7);
      iVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI->seq,(long)(int)local_24);
      iVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI->seq,(long)local_1c);
      local_28 = iVar1 + iVar2 + AU[iVar3][*pvVar6];
      piVar8 = std::min<int>(local_c,&local_28);
      local_c[0] = *piVar8;
    }
    if (local_c[0] < local_10) {
      local_10 = local_c[0];
      local_14 = -4;
    }
    pcVar7 = index(in_RDI,(char *)(ulong)local_18,local_1c);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->W,(long)(int)pcVar7);
    vVar4 = local_14;
    *pvVar6 = iVar1;
    pcVar7 = index(in_RDI,(char *)(ulong)local_18,local_1c);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->WB,(long)(int)pcVar7);
    *pvVar6 = vVar4;
  }
  pcVar7 = index(in_RDI,(char *)0x0,in_RDI->n + -1);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->W,(long)(int)pcVar7);
  return *pvVar6;
}

Assistant:

int ZukerAlgorithm::calculate_W() {
    int min_w = inf, energy = inf, t = 0;

    calculate_V();
    int i = 0;
    for (int j = 1; j < n; ++j) {
        min_w = inf, energy = inf, t = 0;
        if (basepair(seq[i],seq[j])) {
            min_w = min(min_w, V[index(i,j)] + AU[seq[i]][seq[j]]);
            if (energy > min_w) {
                energy = min_w;
                t = -1;
            }
        }
//        de << 1 << " " << min_w << endl;

        min_w = min(min_w, W[index(i,j-1)]);
        if (energy > min_w) {
            energy = min_w;
            t = -2;
        }
//        de << 2 << " " << min_w << endl;

        for (int k = 1; k <= j-4; ++k) {
            min_w = min(min_w, W[index(i,k-1)] + V[index(k,j)] + AU[seq[k]][seq[j]]);
        }
        if (energy > min_w) {
            energy = min_w;
            t = -4;
        }
//        de << 3 << " " << min_w << endl;

        W[index(i,j)] = min_w;
        WB[index(i,j)] = t;
//        de << "Z - l: " << i << ",r: " << j << ",L: " << seq[i] << ",R: " << seq[j] << ",ret: " << min_w  << endl;
    }


    return W[index(0,n-1)];
}